

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::InsertValueCompensation
          (GlobOpt *this,BasicBlock *predecessor,BasicBlock *successor,
          SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap)

{
  ValueType VVar1;
  BasicBlock *pBVar2;
  JitArenaAllocator *alloc;
  code *pcVar3;
  uint uVar4;
  Type this_00;
  Type right;
  bool bVar5;
  BOOLEAN BVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  Instr *pIVar10;
  EntryType *pEVar11;
  Value *pVVar12;
  ArrayValueInfo *pAVar13;
  RegOpnd *pRVar14;
  RegOpnd *pRVar15;
  Instr *pIVar16;
  Value *pVVar17;
  ValueInfo *pVVar18;
  Value *toDataVal;
  Type dst;
  Type pDVar19;
  long lVar20;
  Func **ppFVar21;
  StackSym *pSVar22;
  StackSym *pSVar23;
  ValueType *pVVar24;
  long lVar25;
  JitArenaAllocator *sym;
  size_t requestedBytes;
  bool bVar26;
  undefined1 local_128 [8];
  EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  it;
  List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  local_e8;
  int32 local_b4;
  StackSym *pSStack_b0;
  int32 newBufferSize;
  StackSym *local_a8;
  StackSym *local_a0;
  GlobOptBlockData *local_98;
  int32 local_90;
  uint local_8c;
  GlobOptBlockData *local_88;
  Instr *local_80;
  JitArenaAllocator *local_78;
  StackSym *local_70;
  BasicBlock *local_68;
  GlobOpt *local_60;
  Func *local_58;
  JitArenaAllocator *local_50;
  uint local_44;
  undefined4 *puStack_40;
  int32 newLength;
  bool local_31;
  
  local_68 = predecessor;
  local_60 = this;
  if (predecessor == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49a,"(predecessor)","predecessor");
    if (!bVar5) goto LAB_0043ca3b;
    *puVar9 = 0;
  }
  if (successor == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49b,"(successor)","successor");
    if (!bVar5) goto LAB_0043ca3b;
    *puVar9 = 0;
  }
  if (local_68 == successor) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49c,"(predecessor != successor)","predecessor != successor");
    if (!bVar5) goto LAB_0043ca3b;
    *puVar9 = 0;
  }
  if (symsRequiringCompensationToMergedValueInfoMap->count ==
      symsRequiringCompensationToMergedValueInfoMap->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49d,"(symsRequiringCompensationToMergedValueInfoMap->Count() != 0)",
                       "symsRequiringCompensationToMergedValueInfoMap->Count() != 0");
    if (!bVar5) goto LAB_0043ca3b;
    *puVar9 = 0;
  }
  pBVar2 = local_68->next;
  ppFVar21 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar21 = &local_68->func;
  }
  lVar20 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar20 = 0xd0;
  }
  pIVar16 = *(Instr **)((long)&(*ppFVar21)->m_alloc + lVar20);
  local_31 = true;
  if ((local_60->field_0xf4 & 0x80) != 0) {
    local_31 = successor->dataUseCount != 0;
  }
  local_58 = pIVar16->m_func;
  if ((pIVar16->m_kind == InstrKindBranch) || (pIVar16->m_opcode == BailTarget)) {
    do {
      pIVar10 = pIVar16;
      pIVar16 = pIVar10->m_prev;
    } while (pIVar10->m_prev->m_opcode == ByteCodeUses);
  }
  else {
    pIVar10 = pIVar16->m_next;
    if (pIVar10 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4b2,"(insertBeforeInstr->m_next)","insertBeforeInstr->m_next");
      if (!bVar5) {
LAB_0043ca3b:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
      pIVar10 = pIVar16->m_next;
    }
  }
  local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       &local_60->alloc->super_ArenaAllocator;
  local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014d5408;
  local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer
       = (Type)0x0;
  local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.count =
       0;
  local_e8.length = 0;
  local_e8.increment = 4;
  local_80 = pIVar10;
  JsUtil::
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_128,symsRequiringCompensationToMergedValueInfoMap);
  local_88 = &local_68->globOptData;
  local_98 = &successor->globOptData;
  puStack_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    bVar5 = JsUtil::
            BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_128);
    pDVar19 = local_e8.
              super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
              buffer;
    if (!bVar5) {
      lVar20 = (long)local_e8.
                     super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                     .count;
      if (0 < lVar20) {
        lVar25 = 0;
        do {
          ChangeValueInfo(local_60,local_68,*(Value **)((long)&pDVar19->predecessorValue + lVar25),
                          *(ValueInfo **)((long)&pDVar19->valueInfo + lVar25),false,true);
          lVar25 = lVar25 + 0x10;
        } while (lVar20 * 0x10 != lVar25);
      }
      JsUtil::
      List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::~List(&local_e8);
      return;
    }
    pEVar11 = JsUtil::
              BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
              ::Current((IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         *)local_128);
    pVVar12 = GlobOptBlockData::FindValue
                        (local_88,(pEVar11->
                                  super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                  ).super_KeyValueEntry<Sym_*,_ValueInfo_*>.
                                  super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                                  .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.key);
    if (pVVar12 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4cd,"(predecessorValue)","predecessorValue");
      if (!bVar5) goto LAB_0043ca3b;
      *puStack_40 = 0;
    }
    pVVar18 = pVVar12->valueInfo;
    bVar5 = ValueType::IsAnyOptimizedArray(&pVVar18->super_ValueType);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4d1,"(predecessorValueInfo->IsAnyOptimizedArray())",
                         "predecessorValueInfo->IsAnyOptimizedArray()");
      if (!bVar5) goto LAB_0043ca3b;
      *puStack_40 = 0;
    }
    it.
    super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
    ._24_8_ = pVVar18;
    pAVar13 = ValueInfo::AsArrayValueInfo(pVVar18);
    pSVar22 = pAVar13->headSegmentSym;
    sym = (JitArenaAllocator *)pAVar13->headSegmentLengthSym;
    local_70 = pAVar13->lengthSym;
    pAVar13 = ValueInfo::AsArrayValueInfo
                        ((pEVar11->
                         super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         ).super_KeyValueEntry<Sym_*,_ValueInfo_*>.
                         super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                         .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.value);
    local_a8 = pAVar13->headSegmentSym;
    local_50 = (JitArenaAllocator *)pAVar13->headSegmentLengthSym;
    pSVar23 = pAVar13->lengthSym;
    pSStack_b0 = pSVar22;
    if ((pSVar22 == (StackSym *)0x0) && (local_a8 != (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4db,"(!mergedHeadSegmentSym || predecessorHeadSegmentSym)",
                         "!mergedHeadSegmentSym || predecessorHeadSegmentSym");
      if (!bVar5) goto LAB_0043ca3b;
      *puStack_40 = 0;
    }
    if ((sym == (JitArenaAllocator *)0x0) && (local_50 != (JitArenaAllocator *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4dc,"(!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym)",
                         "!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym");
      if (!bVar5) goto LAB_0043ca3b;
      *puStack_40 = 0;
    }
    if ((local_70 == (StackSym *)0x0) && (pSVar23 != (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4dd,"(!mergedLengthSym || predecessorLengthSym)",
                         "!mergedLengthSym || predecessorLengthSym");
      if (!bVar5) goto LAB_0043ca3b;
      *puStack_40 = 0;
    }
    bVar26 = local_a8 != (StackSym *)0x0;
    bVar5 = pSStack_b0 != local_a8;
    local_a0 = pSVar23;
    if (bVar5 && bVar26) {
      pRVar14 = IR::RegOpnd::New(local_a8,local_a8->m_type,local_58);
      pRVar15 = IR::RegOpnd::New(pSStack_b0,pSStack_b0->m_type,local_58);
      pIVar16 = IR::Instr::New(Ld_A,&pRVar14->super_Opnd,&pRVar15->super_Opnd,local_58);
      IR::Opnd::SetIsJITOptimizedReg(pIVar16->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar16->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar16,local_80);
      IR::Instr::InsertBefore(local_80,pIVar16);
    }
    bVar5 = bVar5 && bVar26;
    if ((local_50 != (JitArenaAllocator *)0x0) && (sym != local_50)) {
      pRVar14 = IR::RegOpnd::New((StackSym *)local_50,
                                 *(IRType *)
                                  ((long)&(local_50->super_ArenaAllocator).
                                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                          .super_ArenaData.fullBlocks + 4),local_58);
      pRVar15 = IR::RegOpnd::New((StackSym *)sym,
                                 *(IRType *)
                                  ((long)&(sym->super_ArenaAllocator).
                                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                          .super_ArenaData.fullBlocks + 4),local_58);
      pIVar16 = IR::Instr::New(Ld_A,&pRVar14->super_Opnd,&pRVar15->super_Opnd,local_58);
      IR::Opnd::SetIsJITOptimizedReg(pIVar16->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar16->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar16,local_80);
      IR::Instr::InsertBefore(local_80,pIVar16);
      BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((local_68->globOptData).liveVarSyms,
                         *(BVIndex *)
                          &(sym->super_ArenaAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           super_ArenaData.bigBlocks);
      if (BVar6 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puStack_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x4fe,
                           "(predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id))"
                           ,
                           "predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id)"
                          );
        if (!bVar5) goto LAB_0043ca3b;
        *puStack_40 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((local_68->globOptData).liveVarSyms,
                 *(BVIndex *)
                  &(local_50->super_ArenaAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   super_ArenaData.bigBlocks);
      pVVar17 = GlobOptBlockData::FindValue(local_88,(Sym *)sym);
      if (pVVar17 == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puStack_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x502,"(predecessorHeadSegmentLengthValue)",
                           "predecessorHeadSegmentLengthValue");
        if (!bVar5) goto LAB_0043ca3b;
        *puStack_40 = 0;
      }
      GlobOptBlockData::SetValue(local_88,pVVar17,(Sym *)local_50);
      bVar5 = true;
      if (local_31 != false) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((successor->globOptData).liveVarSyms,
                   *(BVIndex *)
                    &(local_50->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData.bigBlocks);
        local_78 = (JitArenaAllocator *)GlobOptBlockData::FindValue(local_98,(Sym *)local_50);
        if (local_78 == (JitArenaAllocator *)0x0) {
          pVVar17 = CopyValue(local_60,pVVar17);
          GlobOptBlockData::SetValue(local_98,pVVar17,(Sym *)local_50);
        }
        else {
          if (*(ValueNumber *)
               &(local_78->super_ArenaAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                super_Allocator.outOfMemoryFunc == pVVar17->valueNumber) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puStack_40 = 1;
            bVar26 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                ,0x50b,
                                "(mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber())"
                                ,
                                "mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber()"
                               );
            if (!bVar26) goto LAB_0043ca3b;
            *puStack_40 = 0;
          }
          pVVar18 = (ValueInfo *)
                    (local_78->super_ArenaAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.recoverMemoryFunc;
          if (pVVar17->valueInfo != pVVar18) {
            alloc = local_60->alloc;
            VVar1.field_0 =
                 (anon_union_2_4_ea848c7b_for_ValueType_13)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(pVVar17->valueInfo->super_ValueType).field_0.field_0;
            ValueType::Verify((ValueType)
                              *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                               &(pVVar18->super_ValueType).field_0.field_0);
            ValueType::Verify(VVar1);
            pVVar24 = &pVVar18->super_ValueType;
            bVar26 = ValueType::operator==(pVVar24,VVar1);
            local_8c = (uint)(ushort)VVar1.field_0;
            if (bVar26) {
              aVar7.field_0 = (pVVar24->field_0).field_0;
            }
            else {
              ValueType::ValueType
                        ((ValueType *)&local_44,(pVVar24->field_0).bits | (ushort)VVar1.field_0);
              bVar26 = ValueType::OneOn((ValueType *)&local_44,Object);
              if (bVar26) {
                aVar7.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::MergeWithObject(pVVar24,SUB42(local_8c,0));
              }
              else {
                aVar7.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(local_44._0_2_);
              }
            }
            pVVar18 = ValueInfo::MergeLikelyIntValueInfo
                                (alloc,(Value *)local_78,pVVar17,(ValueType)aVar7.field_0);
            ::Value::SetValueInfo((Value *)local_78,pVVar18);
          }
        }
      }
    }
    pSVar22 = local_a0;
    if ((local_a0 == (StackSym *)0x0) || (local_70 == local_a0)) {
      if (bVar5) goto LAB_0043c5e0;
    }
    else {
      pRVar14 = IR::RegOpnd::New(local_a0,local_a0->m_type,local_58);
      pRVar15 = IR::RegOpnd::New(local_70,local_70->m_type,local_58);
      pIVar16 = IR::Instr::New(Ld_I4,&pRVar14->super_Opnd,&pRVar15->super_Opnd,local_58);
      IR::Opnd::SetIsJITOptimizedReg(pIVar16->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar16->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar16,local_80);
      IR::Instr::InsertBefore(local_80,pIVar16);
      BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((local_68->globOptData).liveVarSyms,(local_70->super_Sym).m_id);
      if (BVar6 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puStack_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x52d,
                           "(predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id))",
                           "predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id)");
        if (!bVar5) goto LAB_0043ca3b;
        *puStack_40 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((local_68->globOptData).liveVarSyms,(pSVar22->super_Sym).m_id);
      pVVar17 = GlobOptBlockData::FindValue(local_88,&local_70->super_Sym);
      if (pVVar17 == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puStack_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x530,"(predecessorLengthValue)","predecessorLengthValue");
        if (!bVar5) goto LAB_0043ca3b;
        *puStack_40 = 0;
      }
      GlobOptBlockData::SetValue(local_88,pVVar17,&pSVar22->super_Sym);
      pSVar22 = local_a0;
      if (local_31 != false) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((successor->globOptData).liveVarSyms,(local_a0->super_Sym).m_id);
        toDataVal = GlobOptBlockData::FindValue(local_98,&pSVar22->super_Sym);
        if (toDataVal == (Value *)0x0) {
          pVVar17 = CopyValue(local_60,pVVar17);
          GlobOptBlockData::SetValue(local_98,pVVar17,&local_a0->super_Sym);
        }
        else {
          if (toDataVal->valueNumber == pVVar17->valueNumber) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puStack_40 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x539,
                               "(mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber())"
                               ,
                               "mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber()"
                              );
            if (!bVar5) goto LAB_0043ca3b;
            *puStack_40 = 0;
          }
          pVVar18 = toDataVal->valueInfo;
          if (pVVar17->valueInfo != pVVar18) {
            local_78 = local_60->alloc;
            VVar1.field_0 =
                 (anon_union_2_4_ea848c7b_for_ValueType_13)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(pVVar17->valueInfo->super_ValueType).field_0.field_0;
            ValueType::Verify((ValueType)
                              *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                               &(pVVar18->super_ValueType).field_0.field_0);
            ValueType::Verify(VVar1);
            pVVar24 = &pVVar18->super_ValueType;
            bVar5 = ValueType::operator==(pVVar24,VVar1);
            if (bVar5) {
              aVar7.field_0 = (pVVar24->field_0).field_0;
            }
            else {
              ValueType::ValueType
                        ((ValueType *)&local_44,(pVVar24->field_0).bits | (ushort)VVar1.field_0);
              bVar5 = ValueType::OneOn((ValueType *)&local_44,Object);
              if (bVar5) {
                aVar7.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::MergeWithObject(pVVar24,VVar1);
              }
              else {
                aVar7.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(local_44._0_2_);
              }
            }
            pVVar18 = ValueInfo::MergeLikelyIntValueInfo
                                (local_78,toDataVal,pVVar17,(ValueType)aVar7.field_0);
            ::Value::SetValueInfo(toDataVal,pVVar18);
          }
        }
      }
LAB_0043c5e0:
      pSVar22 = pSStack_b0;
      if (local_a8 != (StackSym *)0x0) {
        pSVar22 = local_a8;
      }
      if (local_50 != (JitArenaAllocator *)0x0) {
        sym = local_50;
      }
      pSVar23 = local_70;
      if (local_a0 != (StackSym *)0x0) {
        pSVar23 = local_a0;
      }
      pAVar13 = ArrayValueInfo::New(local_60->alloc,
                                    (ValueType)
                                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                     &((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                      (it.
                                       super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                                       ._24_8_ + 8))->field_0,pSVar22,(StackSym *)sym,pSVar23,
                                    *(Sym **)(it.
                                              super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                                              ._24_8_ + 0x10));
      this_00 = local_e8.
                super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                alloc;
      pDVar19 = local_e8.
                super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                buffer;
      if (local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
          .buffer == (Type)0x0) {
        uVar4 = local_e8.increment;
        if (local_e8.increment < 1) {
          uVar4 = 0;
        }
        if (local_e8.increment < 1) {
          pDVar19 = (Type)&DAT_00000008;
        }
        else {
          BVar8 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar8 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puStack_40 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                               "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar5) goto LAB_0043ca3b;
            *puStack_40 = 0;
          }
          pDVar19 = (Type)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                          ::AllocInternal(&this_00->
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                          ,(ulong)uVar4 << 4);
          if (pDVar19 == (Type)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puStack_40 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar5) goto LAB_0043ca3b;
            *puStack_40 = 0;
            pDVar19 = (Type)0x0;
          }
        }
        local_e8.length = uVar4;
        local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
        count = 0;
        local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
        buffer = pDVar19;
      }
      else {
        right = local_e8.length;
        lVar20 = (long)local_e8.length;
        if (local_e8.
            super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.count
            == local_e8.length || local_e8.length < 0) {
          local_70 = (StackSym *)
                     CONCAT44(local_70._4_4_,
                              local_e8.
                              super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                              .count);
          local_44 = 0;
          local_b4 = 0;
          local_90 = 0;
          bVar5 = Int32Math::Add(local_e8.length,1,(int32 *)&local_44);
          if ((bVar5) || (bVar5 = Int32Math::Shl(local_44,1,(int32 *)&local_44), bVar5)) {
            JsUtil::ExternalApi::RaiseOnIntOverflow();
          }
          if ((int)local_44 < 1) {
            local_44 = 0;
          }
          bVar5 = Int32Math::Mul(0x10,local_44,&local_b4);
          if ((bVar5) || (bVar5 = Int32Math::Mul(0x10,right,&local_90), bVar5)) {
            JsUtil::ExternalApi::RaiseOnIntOverflow();
          }
          local_50 = (JitArenaAllocator *)
                     local_e8.
                     super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                     .alloc;
          if ((ulong)local_44 == 0) {
            dst = (Type)&DAT_00000008;
          }
          else {
            requestedBytes = (ulong)local_44 << 4;
            if ((int)local_44 < 0) {
              requestedBytes = 0xffffffffffffffff;
            }
            BVar8 = ExceptionCheck::CanHandleOutOfMemory();
            if (BVar8 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puStack_40 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                 ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                 "ExceptionCheck::CanHandleOutOfMemory()");
              if (!bVar5) goto LAB_0043ca3b;
              *puStack_40 = 0;
            }
            dst = (Type)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                        AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                       *)local_50,requestedBytes);
            if (dst == (Type)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puStack_40 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                 ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
              if (!bVar5) goto LAB_0043ca3b;
              *puStack_40 = 0;
              dst = (Type)0x0;
            }
          }
          lVar25 = (long)(int)local_44;
          js_memcpy_s(dst,lVar25 << 4,pDVar19,lVar20 << 4);
          if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015bf41c) == 1) {
            (*g_verifyIsNotBarrierAddress)(dst,lVar25);
          }
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_50,
                     pDVar19,(long)local_90);
          local_e8.length = local_44;
          local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
          .count = (int)local_70;
          local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
          .buffer = dst;
        }
      }
      local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
      buffer[local_e8.
             super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.count
            ].predecessorValue = pVVar12;
      local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
      buffer[local_e8.
             super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.count
            ].valueInfo = pAVar13;
      local_e8.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
      count = local_e8.
              super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
              count + 1;
    }
    JsUtil::
    BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_128);
  } while( true );
}

Assistant:

void GlobOpt::InsertValueCompensation(
    BasicBlock *const predecessor,
    BasicBlock *const successor,
    const SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap)
{
    Assert(predecessor);
    Assert(successor);
    AssertOrFailFast(predecessor != successor);
    Assert(symsRequiringCompensationToMergedValueInfoMap->Count() != 0);

    IR::Instr *insertBeforeInstr = predecessor->GetLastInstr();
    Func *const func = insertBeforeInstr->m_func;
    bool setLastInstrInPredecessor;
    // If this is a loop back edge, and the successor has been completed, don't attempt to update its block data.
    // The update is unnecessary, and the data has likely been freed.
    bool updateSuccessorBlockData = !this->isPerformingLoopBackEdgeCompensation || successor->GetDataUseCount() > 0;

    if(insertBeforeInstr->IsBranchInstr() || insertBeforeInstr->m_opcode == Js::OpCode::BailTarget)
    {
        // Don't insert code between the branch and the corresponding ByteCodeUses instructions
        while(insertBeforeInstr->m_prev->m_opcode == Js::OpCode::ByteCodeUses)
        {
            insertBeforeInstr = insertBeforeInstr->m_prev;
        }
        setLastInstrInPredecessor = false;
    }
    else
    {
        // Insert at the end of the block and set the last instruction
        Assert(insertBeforeInstr->m_next);
        insertBeforeInstr = insertBeforeInstr->m_next; // Instruction after the last instruction in the predecessor
        setLastInstrInPredecessor = true;
    }

    GlobOptBlockData &predecessorBlockData = predecessor->globOptData;
    GlobOptBlockData &successorBlockData = successor->globOptData;
    struct DelayChangeValueInfo
    {
        Value* predecessorValue;
        ArrayValueInfo* valueInfo;
        void ChangeValueInfo(BasicBlock* predecessor, GlobOpt* g)
        {
            g->ChangeValueInfo(
                predecessor,
                predecessorValue,
                valueInfo,
                false /*allowIncompatibleType*/,
                true /*compensated*/);
        }
    };
    JsUtil::List<DelayChangeValueInfo, ArenaAllocator> delayChangeValueInfo(alloc);
    for(auto it = symsRequiringCompensationToMergedValueInfoMap->GetIterator(); it.IsValid(); it.MoveNext())
    {
        const auto &entry = it.Current();
        Sym *const sym = entry.Key();
        Value *const predecessorValue = predecessorBlockData.FindValue(sym);
        Assert(predecessorValue);
        ValueInfo *const predecessorValueInfo = predecessorValue->GetValueInfo();

        // Currently, array value infos are the only ones that require compensation based on values
        Assert(predecessorValueInfo->IsAnyOptimizedArray());
        const ArrayValueInfo *const predecessorArrayValueInfo = predecessorValueInfo->AsArrayValueInfo();
        StackSym *const predecessorHeadSegmentSym = predecessorArrayValueInfo->HeadSegmentSym();
        StackSym *const predecessorHeadSegmentLengthSym = predecessorArrayValueInfo->HeadSegmentLengthSym();
        StackSym *const predecessorLengthSym = predecessorArrayValueInfo->LengthSym();
        ValueInfo *const mergedValueInfo = entry.Value();
        const ArrayValueInfo *const mergedArrayValueInfo = mergedValueInfo->AsArrayValueInfo();
        StackSym *const mergedHeadSegmentSym = mergedArrayValueInfo->HeadSegmentSym();
        StackSym *const mergedHeadSegmentLengthSym = mergedArrayValueInfo->HeadSegmentLengthSym();
        StackSym *const mergedLengthSym = mergedArrayValueInfo->LengthSym();
        Assert(!mergedHeadSegmentSym || predecessorHeadSegmentSym);
        Assert(!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym);
        Assert(!mergedLengthSym || predecessorLengthSym);

        bool compensated = false;
        if(mergedHeadSegmentSym && predecessorHeadSegmentSym != mergedHeadSegmentSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_A,
                    IR::RegOpnd::New(mergedHeadSegmentSym, mergedHeadSegmentSym->GetType(), func),
                    IR::RegOpnd::New(predecessorHeadSegmentSym, predecessorHeadSegmentSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;
        }

        if(mergedHeadSegmentLengthSym && predecessorHeadSegmentLengthSym != mergedHeadSegmentLengthSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_A,
                    IR::RegOpnd::New(mergedHeadSegmentLengthSym, mergedHeadSegmentLengthSym->GetType(), func),
                    IR::RegOpnd::New(predecessorHeadSegmentLengthSym, predecessorHeadSegmentLengthSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;

            // Merge the head segment length value
            Assert(predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id));
            predecessorBlockData.liveVarSyms->Set(mergedHeadSegmentLengthSym->m_id);
            Value *const predecessorHeadSegmentLengthValue =
                predecessorBlockData.FindValue(predecessorHeadSegmentLengthSym);
            Assert(predecessorHeadSegmentLengthValue);
            predecessorBlockData.SetValue(predecessorHeadSegmentLengthValue, mergedHeadSegmentLengthSym);

            if (updateSuccessorBlockData)
            {
                successorBlockData.liveVarSyms->Set(mergedHeadSegmentLengthSym->m_id);
                Value *const mergedHeadSegmentLengthValue = successorBlockData.FindValue(mergedHeadSegmentLengthSym);
                if(mergedHeadSegmentLengthValue)
                {
                    Assert(mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber());
                    if(predecessorHeadSegmentLengthValue->GetValueInfo() != mergedHeadSegmentLengthValue->GetValueInfo())
                    {
                        mergedHeadSegmentLengthValue->SetValueInfo(
                            ValueInfo::MergeLikelyIntValueInfo(
                                this->alloc,
                                mergedHeadSegmentLengthValue,
                                predecessorHeadSegmentLengthValue,
                                mergedHeadSegmentLengthValue->GetValueInfo()->Type()
                                    .Merge(predecessorHeadSegmentLengthValue->GetValueInfo()->Type())));
                    }
                }
                else
                {
                    successorBlockData.SetValue(CopyValue(predecessorHeadSegmentLengthValue), mergedHeadSegmentLengthSym);
                }
            }
        }

        if(mergedLengthSym && predecessorLengthSym != mergedLengthSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_I4,
                    IR::RegOpnd::New(mergedLengthSym, mergedLengthSym->GetType(), func),
                    IR::RegOpnd::New(predecessorLengthSym, predecessorLengthSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;

            // Merge the length value
            Assert(predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id));
            predecessorBlockData.liveVarSyms->Set(mergedLengthSym->m_id);
            Value *const predecessorLengthValue = predecessorBlockData.FindValue(predecessorLengthSym);
            Assert(predecessorLengthValue);
            predecessorBlockData.SetValue(predecessorLengthValue, mergedLengthSym);

            if (updateSuccessorBlockData)
            {
                successorBlockData.liveVarSyms->Set(mergedLengthSym->m_id);
                Value *const mergedLengthValue = successorBlockData.FindValue(mergedLengthSym);
                if(mergedLengthValue)
                {
                    Assert(mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber());
                    if(predecessorLengthValue->GetValueInfo() != mergedLengthValue->GetValueInfo())
                    {
                        mergedLengthValue->SetValueInfo(
                            ValueInfo::MergeLikelyIntValueInfo(
                                this->alloc,
                                mergedLengthValue,
                                predecessorLengthValue,
                                mergedLengthValue->GetValueInfo()->Type().Merge(predecessorLengthValue->GetValueInfo()->Type())));
                    }
                }
                else
                {
                    successorBlockData.SetValue(CopyValue(predecessorLengthValue), mergedLengthSym);
                }
            }
        }

        if(compensated)
        {
            // Save the new ValueInfo for later.
            // We don't want other symbols needing compensation to see this new one
            delayChangeValueInfo.Add({
                predecessorValue,
                ArrayValueInfo::New(
                    alloc,
                    predecessorValueInfo->Type(),
                    mergedHeadSegmentSym ? mergedHeadSegmentSym : predecessorHeadSegmentSym,
                    mergedHeadSegmentLengthSym ? mergedHeadSegmentLengthSym : predecessorHeadSegmentLengthSym,
                    mergedLengthSym ? mergedLengthSym : predecessorLengthSym,
                    predecessorValueInfo->GetSymStore())
            });
        }
    }

    // Once we've compensated all the symbols, update the new ValueInfo.
    delayChangeValueInfo.Map([predecessor, this](int, DelayChangeValueInfo d) { d.ChangeValueInfo(predecessor, this); });

    if(setLastInstrInPredecessor)
    {
        predecessor->SetLastInstr(insertBeforeInstr->m_prev);
    }
}